

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::getAtomicFuncArgument
              (AtomicOperation op,IVec3 *invocationID,IVec2 *dispatchSizeXY)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = invocationID->m_data[0];
  iVar3 = invocationID->m_data[1];
  iVar2 = invocationID->m_data[2];
  if (op < ATOMIC_OPERATION_EXCHANGE) {
    iVar3 = iVar3 * iVar3 + iVar1 * iVar1;
    iVar2 = iVar2 * iVar2;
  }
  else {
    if (op != ATOMIC_OPERATION_EXCHANGE) {
      return -1;
    }
    iVar2 = (iVar2 * dispatchSizeXY->m_data[0] + iVar1) * dispatchSizeXY->m_data[1];
  }
  return iVar2 + iVar3;
}

Assistant:

T						z			(void) const { DE_STATIC_ASSERT(Size >= 3); return m_data[2]; }